

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

undefined8 __thiscall cppcms::json::value::save_abi_cxx11_(value *this,int how)

{
  uint in_EDX;
  value *in_RSI;
  undefined8 in_RDI;
  int tabs;
  ostringstream ss;
  ostringstream local_190 [380];
  uint local_14;
  
  local_14 = in_EDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  write(in_RSI,(int)local_190,(void *)(ulong)-(uint)((local_14 & 1) == 0),
        (ulong)((local_14 & 1) - 1));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string value::save(int how) const
	{
		std::ostringstream ss;
		int tabs=(how & readable) ? 0 : -1;
		write(ss,tabs);
		return ss.str();
	}